

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O1

void CSOAA::compute_wap_values
               (vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_> *costs)

{
  wclass **ppwVar1;
  __normal_iterator<COST_SENSITIVE::wclass_**,_std::vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>_>
  __first;
  __normal_iterator<COST_SENSITIVE::wclass_**,_std::vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>_>
  __last;
  wclass *pwVar2;
  long lVar3;
  ulong uVar4;
  __normal_iterator<COST_SENSITIVE::wclass_**,_std::vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>_>
  _Var5;
  wclass **ppwVar6;
  wclass **ppwVar7;
  pointer ppwVar8;
  wclass **ppwVar9;
  value_type __val;
  size_t __n;
  __normal_iterator<COST_SENSITIVE::wclass_**,_std::vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>_>
  __i;
  wclass **ppwVar10;
  value_type __val_2;
  __normal_iterator<COST_SENSITIVE::wclass_**,_std::vector<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>_>
  _Var11;
  
  __first._M_current =
       (costs->
       super__Vector_base<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>).
       _M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (costs->
       super__Vector_base<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (__first._M_current != __last._M_current) {
    uVar4 = (long)__last._M_current - (long)__first._M_current >> 3;
    lVar3 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<COST_SENSITIVE::wclass**,std::vector<COST_SENSITIVE::wclass*,std::allocator<COST_SENSITIVE::wclass*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(COST_SENSITIVE::wclass_const*,COST_SENSITIVE::wclass_const*)>>
              (__first,__last,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_COST_SENSITIVE::wclass_*,_const_COST_SENSITIVE::wclass_*)>
                )0x24af77);
    ppwVar10 = __first._M_current + 1;
    _Var11._M_current = __first._M_current;
    if ((long)__last._M_current - (long)__first._M_current < 0x81) {
      for (; ppwVar10 != __last._M_current; ppwVar10 = ppwVar10 + 1) {
        pwVar2 = *ppwVar10;
        if ((*__first._M_current)->x <= pwVar2->x) {
          _Var5._M_current = ppwVar10;
          ppwVar7 = ppwVar10;
          if (pwVar2->x < (*_Var11._M_current)->x) {
            do {
              _Var5._M_current = ppwVar7 + -1;
              ppwVar9 = ppwVar7 + -2;
              *ppwVar7 = ppwVar7[-1];
              ppwVar7 = _Var5._M_current;
            } while (pwVar2->x <= (*ppwVar9)->x && (*ppwVar9)->x != pwVar2->x);
          }
        }
        else {
          memmove((void *)((long)_Var11._M_current +
                          (0x10 - ((long)ppwVar10 - (long)__first._M_current))),__first._M_current,
                  (long)ppwVar10 - (long)__first._M_current);
          _Var5._M_current = __first._M_current;
        }
        *_Var5._M_current = pwVar2;
        _Var11._M_current = ppwVar10;
      }
    }
    else {
      __n = 8;
      ppwVar7 = ppwVar10;
      do {
        ppwVar9 = __first._M_current + __n;
        pwVar2 = *(wclass **)((long)__first._M_current + __n);
        if ((*__first._M_current)->x <= pwVar2->x) {
          _Var5._M_current = ppwVar9;
          ppwVar6 = ppwVar7;
          if (pwVar2->x < (*_Var11._M_current)->x) {
            do {
              _Var5._M_current = ppwVar6 + -1;
              ppwVar1 = ppwVar6 + -2;
              *ppwVar6 = ppwVar6[-1];
              ppwVar6 = _Var5._M_current;
            } while (pwVar2->x <= (*ppwVar1)->x && (*ppwVar1)->x != pwVar2->x);
          }
        }
        else {
          memmove(ppwVar10,__first._M_current,__n);
          _Var5._M_current = __first._M_current;
        }
        *_Var5._M_current = pwVar2;
        __n = __n + 8;
        ppwVar7 = ppwVar7 + 1;
        _Var11._M_current = ppwVar9;
      } while (__n != 0x80);
      for (ppwVar10 = __first._M_current + 0x10; ppwVar10 != __last._M_current;
          ppwVar10 = ppwVar10 + 1) {
        pwVar2 = *ppwVar10;
        ppwVar7 = ppwVar10;
        ppwVar9 = ppwVar10;
        if (pwVar2->x <= ppwVar10[-1]->x && ppwVar10[-1]->x != pwVar2->x) {
          do {
            ppwVar7 = ppwVar9 + -1;
            ppwVar6 = ppwVar9 + -2;
            *ppwVar9 = ppwVar9[-1];
            ppwVar9 = ppwVar7;
          } while (pwVar2->x <= (*ppwVar6)->x && (*ppwVar6)->x != pwVar2->x);
        }
        *ppwVar7 = pwVar2;
      }
    }
  }
  (*(costs->super__Vector_base<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>)
    ._M_impl.super__Vector_impl_data._M_start)->wap_value = 0.0;
  ppwVar8 = (costs->
            super__Vector_base<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>)
            ._M_impl.super__Vector_impl_data._M_start;
  if (8 < (ulong)((long)(costs->
                        super__Vector_base<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppwVar8)) {
    uVar4 = 1;
    do {
      ppwVar8[uVar4]->wap_value =
           (ppwVar8[uVar4]->x - ppwVar8[uVar4 - 1]->x) / (float)uVar4 +
           ppwVar8[uVar4 - 1]->wap_value;
      uVar4 = uVar4 + 1;
      ppwVar8 = (costs->
                super__Vector_base<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(costs->
                                   super__Vector_base<COST_SENSITIVE::wclass_*,_std::allocator<COST_SENSITIVE::wclass_*>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppwVar8 >> 3)
            );
  }
  return;
}

Assistant:

void compute_wap_values(vector<COST_SENSITIVE::wclass*> costs)
{
  std::sort(costs.begin(), costs.end(), cmp_wclass_ptr);
  costs[0]->wap_value = 0.;
  for (size_t i = 1; i < costs.size(); i++)
    costs[i]->wap_value = costs[i - 1]->wap_value + (costs[i]->x - costs[i - 1]->x) / (float)i;
}